

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

int Vec_QueMoveUp(Vec_Que_t *p,int v)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  int local_24;
  int local_20;
  int fMoved;
  int parent;
  int i;
  float Cost;
  int v_local;
  Vec_Que_t *p_local;
  
  fVar2 = Vec_QuePrio(p,v);
  fMoved = p->pOrder[v];
  local_24 = 0;
  if (p->pOrder[v] == -1) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (p->pHeap[fMoved] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  while( true ) {
    local_20 = fMoved >> 1;
    bVar1 = false;
    if (1 < fMoved) {
      fVar3 = Vec_QuePrio(p,p->pHeap[local_20]);
      bVar1 = fVar3 < fVar2;
    }
    if (!bVar1) break;
    p->pHeap[fMoved] = p->pHeap[local_20];
    p->pOrder[p->pHeap[fMoved]] = fMoved;
    fMoved = local_20;
    local_24 = 1;
  }
  p->pHeap[fMoved] = v;
  p->pOrder[v] = fMoved;
  return local_24;
}

Assistant:

static inline int Vec_QueMoveUp( Vec_Que_t * p, int v )
{
    float Cost = Vec_QuePrio(p, v);
    int i      = p->pOrder[v];
    int parent = i >> 1;
    int fMoved = 0;
    assert( p->pOrder[v] != -1 );
    assert( p->pHeap[i] == v );
    while ( i > 1 && Cost > Vec_QuePrio(p, p->pHeap[parent]) )
    {
        p->pHeap[i]            = p->pHeap[parent];
        p->pOrder[p->pHeap[i]] = i;
        i                      = parent;
        parent                 = i >> 1;
        fMoved                 = 1;
    }
    p->pHeap[i]  = v;
    p->pOrder[v] = i;
    return fMoved;
}